

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O3

IterateResult __thiscall gl3cts::TextureSwizzle::SmokeTest::iterate(SmokeTest *this)

{
  GLint GVar1;
  GLint GVar2;
  GLint GVar3;
  GLint GVar4;
  bool bVar5;
  int iVar6;
  size_t format_idx;
  size_t target_idx;
  undefined4 extraout_var;
  TestError *this_00;
  size_t access_idx;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  pointer_____offset_0x10___ *ppuVar11;
  SmokeTest *this_01;
  size_t channel_idx;
  size_t sVar12;
  GLint source_channel_sizes [4];
  GLint local_88 [6];
  testCase local_70;
  
  format_idx = get_index_of_format(0x8d70);
  target_idx = get_index_of_target(0x8c1a);
  local_88[0] = 0;
  local_88[1] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  testInit(this);
  if (((*(uint *)(texture_targets + target_idx * 0x30 + 0x28) | 2) == 0x9102) &&
     (this->m_is_ms_supported == false)) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_00,"Texture target is not support by implementation","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
               ,0x9ba);
    ppuVar11 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    prepareSourceTexture(this,format_idx,target_idx,local_88);
    this_01 = this;
    iVar6 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                      (this,format_idx,target_idx);
    if ((char)iVar6 != '\0') {
      access_idx = 0;
      do {
        bVar5 = isTargetSuppByAccess(this_01,access_idx,target_idx);
        if (bVar5) {
          lVar10 = 0;
          do {
            GVar1 = (&valid_values)[lVar10];
            lVar9 = 0;
            do {
              GVar2 = (&valid_values)[lVar9];
              lVar8 = 0;
              do {
                GVar3 = (&valid_values)[lVar8];
                lVar7 = 0;
                do {
                  GVar4 = (&valid_values)[lVar7];
                  sVar12 = 0;
                  do {
                    local_70.m_texture_sizes[0] = local_88[0];
                    local_70.m_texture_sizes[1] = local_88[1];
                    local_70.m_texture_sizes[2] = local_88[2];
                    local_70.m_texture_sizes[3] = local_88[3];
                    this_01 = this;
                    local_70.m_channel_index = sVar12;
                    local_70.m_source_texture_format_index = format_idx;
                    local_70.m_source_texture_target_index = target_idx;
                    local_70.m_texture_access_index = access_idx;
                    local_70.m_texture_swizzle_red = GVar1;
                    local_70.m_texture_swizzle_green = GVar2;
                    local_70.m_texture_swizzle_blue = GVar3;
                    local_70.m_texture_swizzle_alpha = GVar4;
                    executeTestCase(this,&local_70);
                    if (this->m_out_tex_id != 0) {
                      iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext
                                [3])();
                      this_01 = (SmokeTest *)&DAT_00000001;
                      (**(code **)(CONCAT44(extraout_var,iVar6) + 0x480))();
                      this->m_out_tex_id = 0;
                    }
                    sVar12 = sVar12 + 1;
                  } while (sVar12 != 4);
                  lVar7 = lVar7 + 1;
                } while (lVar7 != 6);
                lVar8 = lVar8 + 1;
              } while (lVar8 != 6);
              lVar9 = lVar9 + 1;
            } while (lVar9 != 6);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 6);
        }
        access_idx = access_idx + 1;
      } while (access_idx != 0xe);
      tcu::TestContext::setTestResult
                (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Failed to prepare source texture",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
               ,0x9c1);
    ppuVar11 = &tcu::TestError::typeinfo;
  }
  __cxa_throw(this_00,ppuVar11,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult SmokeTest::iterate()
{
	static const glw::GLenum tested_format = GL_RGBA32UI;
	static const glw::GLenum tested_target = GL_TEXTURE_2D_ARRAY;

	const size_t format_idx = get_index_of_format(tested_format);
	const size_t tgt_idx	= get_index_of_target(tested_target);

	glw::GLint source_channel_sizes[4] = { 0 };

	/*  */
	testInit();

	if (false == isTargetSupported(tgt_idx))
	{
		throw tcu::NotSupportedError("Texture target is not support by implementation", "", __FILE__, __LINE__);
	}

	/* Prepare and fill source texture */
	prepareSourceTexture(format_idx, tgt_idx, source_channel_sizes);
	if (false == fillSourceTexture(format_idx, tgt_idx))
	{
		TCU_FAIL("Failed to prepare source texture");
	}

	/* Iterate over all cases */
	for (size_t access_idx = 0; access_idx < n_texture_access; ++access_idx)
	{
		/* Skip invalid cases */
		if (false == isTargetSuppByAccess(access_idx, tgt_idx))
		{
			continue;
		}

		for (size_t r = 0; r < n_valid_values; ++r)
		{
			for (size_t g = 0; g < n_valid_values; ++g)
			{
				for (size_t b = 0; b < n_valid_values; ++b)
				{
					for (size_t a = 0; a < n_valid_values; ++a)
					{
						for (size_t channel_idx = 0; channel_idx < 4; ++channel_idx)
						{
							const testCase test_case = { channel_idx,
														 format_idx,
														 tgt_idx,
														 access_idx,
														 valid_values[r],
														 valid_values[g],
														 valid_values[b],
														 valid_values[a],
														 { source_channel_sizes[0], source_channel_sizes[1],
														   source_channel_sizes[2], source_channel_sizes[3] } };

							executeTestCase(test_case);

							deinitOutputTexture();
						} /* iteration over channels */
					}	 /* iteration over swizzle combinations */
				}
			}
		}
	} /* iteration over access routines */

	/* Set result - exceptions are thrown in case of any error */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	return STOP;
}